

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

void __thiscall
Catch::Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::
ParserRefImpl<Catch::makeCommandLineParser(Catch::ConfigData&)::__3>
          (ParserRefImpl<Catch::Clara::Opt> *this,string *param_2,string *param_3)

{
  shared_ptr<Catch::Clara::Detail::BoundManyLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quickfix[P]quickfix_src_C___test_catch_amalgamated_cpp:2897:33)>_>
  local_38;
  string *local_28;
  string *hint_local;
  anon_class_8_1_50637480_for_m_lambda *ref_local;
  ParserRefImpl<Catch::Clara::Opt> *this_local;
  
  local_28 = param_3;
  hint_local = param_2;
  ref_local = (anon_class_8_1_50637480_for_m_lambda *)this;
  ComposableParserImpl<Catch::Clara::Opt>::ComposableParserImpl
            (&this->super_ComposableParserImpl<Catch::Clara::Opt>);
  (this->super_ComposableParserImpl<Catch::Clara::Opt>).super_ParserBase._vptr_ParserBase =
       (_func_int **)&PTR__ParserRefImpl_00500410;
  this->m_optionality = Optional;
  std::
  make_shared<Catch::Clara::Detail::BoundManyLambda<Catch::makeCommandLineParser(Catch::ConfigData&)::__3>,Catch::makeCommandLineParser(Catch::ConfigData&)::__3_const&>
            ((anon_class_8_1_50637480_for_m_lambda *)&local_38);
  std::shared_ptr<Catch::Clara::Detail::BoundRef>::
  shared_ptr<Catch::Clara::Detail::BoundManyLambda<Catch::makeCommandLineParser(Catch::ConfigData&)::__3>,void>
            (&this->m_ref,&local_38);
  std::
  shared_ptr<Catch::Clara::Detail::BoundManyLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp:2897:33)>_>
  ::~shared_ptr(&local_38);
  std::__cxx11::string::string((string *)&this->m_hint,local_28);
  std::__cxx11::string::string((string *)&this->m_description);
  return;
}

Assistant:

ParserRefImpl( accept_many_t,
                               LambdaT const& ref,
                               std::string const& hint ):
                    m_ref( std::make_shared<BoundManyLambda<LambdaT>>( ref ) ),
                    m_hint( hint ) {}